

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack19_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x7ffff;
  out[1] = uVar1 >> 0x13;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x13 | (uVar2 & 0x3f) << 0xd;
  out[2] = uVar2 >> 6 & 0x7ffff;
  out[3] = uVar2 >> 0x19;
  uVar1 = in[2];
  out[3] = uVar2 >> 0x19 | (uVar1 & 0xfff) << 7;
  out[4] = uVar1 >> 0xc & 0x7ffff;
  uVar2 = in[3];
  out[5] = uVar1 >> 0x1f;
  out[5] = uVar1 >> 0x1f | (uVar2 & 0x3ffff) << 1;
  out[6] = uVar2 >> 0x12;
  uVar1 = in[4];
  out[6] = uVar2 >> 0x12 | (uVar1 & 0x1f) << 0xe;
  out[7] = uVar1 >> 5 & 0x7ffff;
  return in + 5;
}

Assistant:

const uint32_t *__fastunpack19_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 6)) << (19 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 19);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 12)) << (19 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 19);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 18)) << (19 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 5)) << (19 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 19);
  out++;

  return in + 1;
}